

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O0

void greatest_usage(char *name)

{
  char *name_local;
  
  fprintf(_stdout,
          "Usage: %s [-hlfavex] [-s SUITE] [-t TEST] [-x EXCLUDE]\n  -h, --help  print this Help\n  -l          List suites and tests, then exit (dry run)\n  -f          Stop runner after first failure\n  -a          Abort on first failure (implies -f)\n  -v          Verbose output\n  -s SUITE    only run suites containing substring SUITE\n  -t TEST     only run tests containing substring TEST\n  -e          only run exact name match for -s or -t\n  -x EXCLUDE  exclude tests containing substring EXCLUDE\n"
          ,name);
  return;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}